

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setMeasurementNoiseCovariance
          (ModelBaseEKFFlexEstimatorIMU *this,Matrix *R)

{
  bool bVar1;
  Index IVar2;
  Matrix *R_local;
  ModelBaseEKFFlexEstimatorIMU *this_local;
  
  IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&R->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  bVar1 = false;
  if ((int)IVar2 == 6) {
    IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&R->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    bVar1 = false;
    if ((int)IVar2 == 6) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("unsigned(R.rows())==6 && unsigned(R.cols())==6 && \"ERROR: The measurement noise covariance matrix R has                         incorrect size\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/model-base-ekf-flex-estimator-imu.cpp"
                  ,0xca,
                  "virtual void stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setMeasurementNoiseCovariance(const Matrix &)"
                 );
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->R_,R);
  (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
    _vptr_FlexibilityEstimatorBase[0x44])();
  return;
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::setMeasurementNoiseCovariance
                                            (const Matrix & R)
    {
        BOOST_ASSERT(unsigned(R.rows())==6 &&
                     unsigned(R.cols())==6 &&
                    "ERROR: The measurement noise covariance matrix R has \
                        incorrect size");

        R_=R;
        updateMeasurementCovarianceMatrix_();
    }